

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O0

void CheckHash<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>
               (BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>
                e)

{
  bool bVar1;
  AssertHelper *this;
  hash<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_> *in_RDI;
  AssertHelper *unaff_retaddr;
  AssertionResult gtest_ar;
  size_t hash;
  BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>
  *in_stack_ffffffffffffff78;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *in_stack_ffffffffffffff88;
  ExprBase in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  char *in_stack_ffffffffffffffa0;
  Type type;
  ExprBase in_stack_ffffffffffffffb0;
  AssertionResult local_38;
  ExprBase local_28;
  Kind local_14;
  AssertHelper *local_10;
  hash<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_> *message;
  
  local_14 = mp::internal::ExprBase::kind((ExprBase *)0x14877c);
  this = (AssertHelper *)
         mp::internal::HashCombine<int>
                   ((size_t)in_stack_ffffffffffffff90.impl_,(int *)in_stack_ffffffffffffff88);
  local_10 = this;
  local_28.impl_ =
       (Impl *)mp::
               BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>
               ::arg(in_stack_ffffffffffffff78);
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (in_stack_ffffffffffffff88,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)in_stack_ffffffffffffff90.impl_,
             (type_conflict)((ulong)this >> 0x20));
  local_10 = (AssertHelper *)
             mp::internal::HashCombine<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>
                       ((size_t)in_stack_ffffffffffffff90.impl_,in_stack_ffffffffffffff88);
  message = in_RDI;
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
            (in_stack_ffffffffffffff88,
             (BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>
              )in_stack_ffffffffffffff90.impl_,(type_conflict)((ulong)this >> 0x20));
  std::hash<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>::operator()
            (in_RDI,(Expr)in_stack_ffffffffffffffb0.impl_);
  type = (Type)((ulong)in_RDI >> 0x20);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (char *)in_stack_ffffffffffffff90.impl_,(unsigned_long *)in_stack_ffffffffffffff88,
             (unsigned_long *)this);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_38);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffb0.impl_);
    testing::AssertionResult::failure_message((AssertionResult *)0x148853);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffffb0.impl_,type,in_stack_ffffffffffffffa0,
               in_stack_ffffffffffffff9c,(char *)in_stack_ffffffffffffff90.impl_);
    testing::internal::AssertHelper::operator=(unaff_retaddr,(Message *)message);
    testing::internal::AssertHelper::~AssertHelper(this);
    testing::Message::~Message((Message *)0x14889f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1488ef);
  return;
}

Assistant:

void CheckHash(mp::BasicUnaryExpr<Arg, FIRST, LAST> e) {
  size_t hash = HashCombine<int>(0, e.kind());
  hash = HashCombine<Expr>(hash, e.arg());
  EXPECT_EQ(hash, ExprHash()(e));
}